

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O3

uint64_t CombinedShannonEntropy_SSE2(uint32_t *X,uint32_t *Y)

{
  long lVar1;
  ushort uVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint local_48;
  
  lVar9 = 0;
  uVar7 = 0;
  local_48 = 0;
  uVar6 = 0;
  do {
    auVar11 = packssdw(*(undefined1 (*) [16])(X + uVar6),*(undefined1 (*) [16])(X + uVar6 + 4));
    auVar12 = packssdw(*(undefined1 (*) [16])(X + uVar6 + 8),*(undefined1 (*) [16])(X + uVar6 + 0xc)
                      );
    auVar11 = packsswb(auVar11,auVar12);
    auVar12 = packssdw(*(undefined1 (*) [16])(Y + uVar6),*(undefined1 (*) [16])(Y + uVar6 + 4));
    auVar13 = packssdw(*(undefined1 (*) [16])(Y + uVar6 + 8),*(undefined1 (*) [16])(Y + uVar6 + 0xc)
                      );
    auVar13 = packsswb(auVar12,auVar13);
    auVar12[0] = -('\0' < auVar11[0]);
    auVar12[1] = -('\0' < auVar11[1]);
    auVar12[2] = -('\0' < auVar11[2]);
    auVar12[3] = -('\0' < auVar11[3]);
    auVar12[4] = -('\0' < auVar11[4]);
    auVar12[5] = -('\0' < auVar11[5]);
    auVar12[6] = -('\0' < auVar11[6]);
    auVar12[7] = -('\0' < auVar11[7]);
    auVar12[8] = -('\0' < auVar11[8]);
    auVar12[9] = -('\0' < auVar11[9]);
    auVar12[10] = -('\0' < auVar11[10]);
    auVar12[0xb] = -('\0' < auVar11[0xb]);
    auVar12[0xc] = -('\0' < auVar11[0xc]);
    auVar12[0xd] = -('\0' < auVar11[0xd]);
    auVar12[0xe] = -('\0' < auVar11[0xe]);
    auVar12[0xf] = -('\0' < auVar11[0xf]);
    auVar11[0] = -('\0' < auVar13[0]);
    auVar11[1] = -('\0' < auVar13[1]);
    auVar11[2] = -('\0' < auVar13[2]);
    auVar11[3] = -('\0' < auVar13[3]);
    auVar11[4] = -('\0' < auVar13[4]);
    auVar11[5] = -('\0' < auVar13[5]);
    auVar11[6] = -('\0' < auVar13[6]);
    auVar11[7] = -('\0' < auVar13[7]);
    auVar11[8] = -('\0' < auVar13[8]);
    auVar11[9] = -('\0' < auVar13[9]);
    auVar11[10] = -('\0' < auVar13[10]);
    auVar11[0xb] = -('\0' < auVar13[0xb]);
    auVar11[0xc] = -('\0' < auVar13[0xc]);
    auVar11[0xd] = -('\0' < auVar13[0xd]);
    auVar11[0xe] = -('\0' < auVar13[0xe]);
    auVar11[0xf] = -('\0' < auVar13[0xf]);
    auVar11 = auVar11 | auVar12;
    uVar2 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
            (ushort)(byte)(auVar11[0xf] >> 7) << 0xf;
    if (uVar2 != 0) {
      uVar3 = (uint)uVar2;
      do {
        uVar8 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        lVar1 = uVar6 + uVar8;
        if (((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar12[0xf] >> 7) << 0xf) >> (uVar8 & 0x1f) & 1) != 0) {
          uVar8 = X[lVar1];
          if ((ulong)uVar8 < 0x100) {
            uVar4 = kSLog2Table[uVar8];
          }
          else {
            uVar4 = (*VP8LFastSLog2Slow)(uVar8);
          }
          local_48 = uVar8 + local_48;
          lVar9 = lVar9 + uVar4;
        }
        uVar8 = Y[lVar1] + X[lVar1];
        if (uVar8 < 0x100) {
          uVar4 = kSLog2Table[uVar8];
        }
        else {
          uVar4 = (*VP8LFastSLog2Slow)(uVar8);
        }
        lVar9 = lVar9 + uVar4;
        uVar7 = uVar7 + uVar8;
        uVar3 = uVar3 - 1 & uVar3;
      } while (uVar3 != 0);
    }
    bVar10 = uVar6 < 0xf0;
    uVar6 = uVar6 + 0x10;
  } while (bVar10);
  if (uVar7 < 0x100) {
    uVar4 = kSLog2Table[uVar7];
  }
  else {
    uVar4 = (*VP8LFastSLog2Slow)(uVar7);
  }
  if (local_48 < 0x100) {
    uVar5 = kSLog2Table[local_48];
  }
  else {
    uVar5 = (*VP8LFastSLog2Slow)(local_48);
  }
  return (uVar4 - lVar9) + uVar5;
}

Assistant:

static uint64_t CombinedShannonEntropy_SSE2(const uint32_t X[256],
                                            const uint32_t Y[256]) {
  int i;
  uint64_t retval = 0;
  uint32_t sumX = 0, sumXY = 0;
  const __m128i zero = _mm_setzero_si128();

  for (i = 0; i < 256; i += 16) {
    const __m128i x0 = _mm_loadu_si128((const __m128i*)(X + i +  0));
    const __m128i y0 = _mm_loadu_si128((const __m128i*)(Y + i +  0));
    const __m128i x1 = _mm_loadu_si128((const __m128i*)(X + i +  4));
    const __m128i y1 = _mm_loadu_si128((const __m128i*)(Y + i +  4));
    const __m128i x2 = _mm_loadu_si128((const __m128i*)(X + i +  8));
    const __m128i y2 = _mm_loadu_si128((const __m128i*)(Y + i +  8));
    const __m128i x3 = _mm_loadu_si128((const __m128i*)(X + i + 12));
    const __m128i y3 = _mm_loadu_si128((const __m128i*)(Y + i + 12));
    const __m128i x4 = _mm_packs_epi16(_mm_packs_epi32(x0, x1),
                                       _mm_packs_epi32(x2, x3));
    const __m128i y4 = _mm_packs_epi16(_mm_packs_epi32(y0, y1),
                                       _mm_packs_epi32(y2, y3));
    const int32_t mx = _mm_movemask_epi8(_mm_cmpgt_epi8(x4, zero));
    int32_t my = _mm_movemask_epi8(_mm_cmpgt_epi8(y4, zero)) | mx;
    while (my) {
      const int32_t j = BitsCtz(my);
      uint32_t xy;
      if ((mx >> j) & 1) {
        const int x = X[i + j];
        sumXY += x;
        retval += VP8LFastSLog2(x);
      }
      xy = X[i + j] + Y[i + j];
      sumX += xy;
      retval += VP8LFastSLog2(xy);
      my &= my - 1;
    }
  }
  retval = VP8LFastSLog2(sumX) + VP8LFastSLog2(sumXY) - retval;
  return retval;
}